

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O1

opensshcert_key * opensshcert_new_shared(ssh_keyalg *self,ptrlen blob,strbuf **basepub_out)

{
  ptrlen *ppVar1;
  uint uVar2;
  long *plVar3;
  void *pvVar4;
  size_t sVar5;
  _Bool _Var6;
  opensshcert_key *poVar7;
  strbuf *psVar8;
  long lVar9;
  uint64_t uVar10;
  unsigned_long uVar11;
  strbuf *psVar12;
  ulong n;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  ptrlen pVar16;
  ptrlen pl1;
  BinarySource src [1];
  void *local_90;
  BinarySource local_88;
  strbuf **local_60;
  opensshcert_key *local_58;
  long *local_50;
  strbuf *local_48;
  long local_40;
  long local_38;
  
  local_88.len = blob.len;
  local_88.data = blob.ptr;
  plVar3 = (long *)self->extra;
  local_88.binarysource_ = &local_88;
  local_88.pos = 0;
  local_88.err = BSE_NO_ERROR;
  pVar16 = BinarySource_get_string(local_88.binarysource_);
  _Var6 = ptrlen_eq_string(pVar16,(char *)plVar3[6]);
  if (_Var6) {
    n = 0;
    poVar7 = (opensshcert_key *)safemalloc(1,0x70,0);
    poVar7->basekey = (ssh_key *)0x0;
    (poVar7->sshk).vt = (ssh_keyalg *)0x0;
    poVar7->nonce = (strbuf *)0x0;
    poVar7->serial = 0;
    *(undefined8 *)&poVar7->type = 0;
    poVar7->key_id = (strbuf *)0x0;
    poVar7->valid_principals = (strbuf *)0x0;
    poVar7->valid_after = 0;
    poVar7->valid_before = 0;
    poVar7->critical_options = (strbuf *)0x0;
    poVar7->extensions = (strbuf *)0x0;
    poVar7->reserved = (strbuf *)0x0;
    poVar7->signature_key = (strbuf *)0x0;
    poVar7->signature = (strbuf *)0x0;
    (poVar7->sshk).vt = self;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar8 = strbuf_dup(pVar16);
    poVar7->nonce = psVar8;
    local_58 = poVar7;
    psVar8 = strbuf_new();
    BinarySink_put_stringz(psVar8->binarysink_,(char *)plVar3[7]);
    local_38 = *plVar3;
    local_40 = plVar3[1];
    if (local_40 != 0) {
      n = 0;
      lVar9 = 0;
      do {
        uVar13 = (ulong)(*(int *)(local_38 + lVar9 * 4) + 1);
        if (uVar13 < n) {
          uVar13 = n;
        }
        n = uVar13;
        lVar9 = lVar9 + 1;
      } while (local_40 != lVar9);
    }
    local_50 = plVar3;
    local_48 = psVar8;
    if (n == 0) {
      local_90 = (void *)0x0;
    }
    else {
      local_90 = saferealloc((void *)0x0,n,0x10);
      memset(local_90,0,n << 4);
    }
    local_60 = basepub_out;
    if (local_40 != 0) {
      lVar9 = 0;
      do {
        uVar2 = *(uint *)(local_38 + lVar9 * 4);
        pVar16 = BinarySource_get_string(local_88.binarysource_);
        lVar14 = (ulong)uVar2 * 0x10;
        ppVar1 = (ptrlen *)((long)local_90 + lVar14);
        pvVar4 = *(void **)((long)local_90 + lVar14);
        if ((pvVar4 != (void *)0x0) &&
           (pl1.len = ppVar1->len, pl1.ptr = pvVar4, _Var6 = ptrlen_eq_ptrlen(pl1,pVar16), !_Var6))
        break;
        *ppVar1 = pVar16;
        lVar9 = lVar9 + 1;
      } while (local_40 != lVar9);
    }
    psVar8 = local_48;
    sVar5 = local_50[1];
    if (sVar5 != 0) {
      lVar9 = *local_50;
      sVar15 = 0;
      do {
        if (n == sVar15) {
          __assert_fail("i < bt->nparts",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/openssh-certs.c"
                        ,0xb5,"void blobtrans_write(BlobTransformer *, BinarySink *, blob_fmt)");
        }
        lVar14 = (ulong)*(uint *)(lVar9 + sVar15 * 4) * 0x10;
        pvVar4 = *(void **)((long)local_90 + lVar14);
        if (pvVar4 == (void *)0x0) {
          __assert_fail("part.ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/openssh-certs.c"
                        ,0xb7,"void blobtrans_write(BlobTransformer *, BinarySink *, blob_fmt)");
        }
        pVar16.len = *(size_t *)((long)local_90 + lVar14 + 8);
        pVar16.ptr = pvVar4;
        BinarySink_put_stringpl(psVar8->binarysink_[0].binarysink_,pVar16);
        sVar15 = sVar15 + 1;
      } while (sVar5 != sVar15);
    }
    safefree(local_90);
    uVar10 = BinarySource_get_uint64(local_88.binarysource_);
    poVar7 = local_58;
    local_58->serial = uVar10;
    uVar11 = BinarySource_get_uint32(local_88.binarysource_);
    poVar7->type = (uint32_t)uVar11;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar12 = strbuf_dup(pVar16);
    poVar7->key_id = psVar12;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar12 = strbuf_dup(pVar16);
    poVar7->valid_principals = psVar12;
    uVar10 = BinarySource_get_uint64(local_88.binarysource_);
    poVar7->valid_after = uVar10;
    uVar10 = BinarySource_get_uint64(local_88.binarysource_);
    poVar7->valid_before = uVar10;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar12 = strbuf_dup(pVar16);
    poVar7->critical_options = psVar12;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar12 = strbuf_dup(pVar16);
    poVar7->extensions = psVar12;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar12 = strbuf_dup(pVar16);
    poVar7->reserved = psVar12;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar12 = strbuf_dup(pVar16);
    poVar7->signature_key = psVar12;
    pVar16 = BinarySource_get_string(local_88.binarysource_);
    psVar12 = strbuf_dup(pVar16);
    poVar7->signature = psVar12;
    if ((local_88.binarysource_)->err == BSE_NO_ERROR) {
      *local_60 = psVar8;
      return poVar7;
    }
    (*((poVar7->sshk).vt)->freekey)(&poVar7->sshk);
    strbuf_free(psVar8);
  }
  return (opensshcert_key *)0x0;
}

Assistant:

static opensshcert_key *opensshcert_new_shared(
    const ssh_keyalg *self, ptrlen blob, strbuf **basepub_out)
{
    const opensshcert_extra *extra = self->extra;

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, blob);

    /* Check the initial key-type string */
    if (!ptrlen_eq_string(get_string(src), extra->cert_key_ssh_id))
        return NULL;

    opensshcert_key *ck = snew(opensshcert_key);
    memset(ck, 0, sizeof(*ck));
    ck->sshk.vt = self;

    ck->nonce = strbuf_dup(get_string(src));
    strbuf *basepub = strbuf_new();
    {
        put_stringz(basepub, extra->base_key_ssh_id);

        /* Make the base public key blob out of the public key
         * material in the certificate. This invocation of the
         * blobtrans system doesn't do any format translation, but it
         * does ensure that the right amount of data is copied so that
         * src ends up in the right position to read the remaining
         * certificate fields. */
        BLOBTRANS_DECLARE(bt);
        blobtrans_read(bt, src, extra->pub_fmt);
        blobtrans_write(bt, BinarySink_UPCAST(basepub), extra->pub_fmt);
        blobtrans_clear(bt);
    }
    ck->serial = get_uint64(src);
    ck->type = get_uint32(src);
    ck->key_id = strbuf_dup(get_string(src));
    ck->valid_principals = strbuf_dup(get_string(src));
    ck->valid_after = get_uint64(src);
    ck->valid_before = get_uint64(src);
    ck->critical_options = strbuf_dup(get_string(src));
    ck->extensions = strbuf_dup(get_string(src));
    ck->reserved = strbuf_dup(get_string(src));
    ck->signature_key = strbuf_dup(get_string(src));
    ck->signature = strbuf_dup(get_string(src));


    if (get_err(src)) {
        ssh_key_free(&ck->sshk);
        strbuf_free(basepub);
        return NULL;
    }

    *basepub_out = basepub;
    return ck;
}